

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_CutPerformDerive07(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  word z;
  word t_00;
  word t [2];
  word local_28;
  undefined8 local_20;
  
  z = 1;
  if (4 < nLeaves) {
    if (nLeaves == 7) {
      local_28 = *(word *)pTruth;
      local_20 = *(undefined8 *)(pTruth + 2);
      z = If_Dec7Perform(&local_28,1);
      If_Dec7Verify(&local_28,z);
    }
    else {
      if (nLeaves == 6) {
        t_00 = *(word *)pTruth;
        z = If_Dec6Perform(t_00,1);
      }
      else {
        if (nLeaves != 5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0x420,
                        "word If_CutPerformDerive07(If_Man_t *, unsigned int *, int, int, char *)");
        }
        t_00 = CONCAT44(*pTruth,*pTruth);
        z = If_Dec5Perform(t_00,1);
      }
      If_Dec6Verify(t_00,z);
    }
  }
  return z;
}

Assistant:

word If_CutPerformDerive07( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    if ( nLeaves < 5 )
        return 1;
    if ( nLeaves == 5 )
    {
        word z, t = ((word)pTruth[0] << 32) | (word)pTruth[0];
        z = If_Dec5Perform( t, 1 );
        If_Dec6Verify( t, z );
        return z;
    }
    if ( nLeaves == 6 )
    {
        word z, t = ((word *)pTruth)[0];
        z = If_Dec6Perform( t, 1 );
        If_Dec6Verify( t, z );
        return z;
    }
    if ( nLeaves == 7 )
    {
        word z, t[2];
        t[0] = ((word *)pTruth)[0];
        t[1] = ((word *)pTruth)[1];
        z = If_Dec7Perform( t, 1 );
        If_Dec7Verify( t, z );
        return z;
    }
    assert( 0 );
    return 0;
}